

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::remove_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  Fl_Text_Predelete_Cb *pp_Var4;
  void **ppvVar5;
  void **newCBArgs;
  Fl_Text_Predelete_Cb *newPreDeleteProcs;
  int toRemove;
  int i;
  void *cbArg_local;
  Fl_Text_Predelete_Cb bufPreDeleteCB_local;
  Fl_Text_Buffer *this_local;
  
  newPreDeleteProcs._0_4_ = -1;
  newPreDeleteProcs._4_4_ = 0;
  do {
    if (this->mNPredeleteProcs <= newPreDeleteProcs._4_4_) {
LAB_0021ca77:
      if ((int)newPreDeleteProcs == -1) {
        (*Fl::error)(
                    "Fl_Text_Buffer::remove_predelete_callback(): Can\'t find pre-delete CB to remove"
                    );
      }
      else {
        this->mNPredeleteProcs = this->mNPredeleteProcs + -1;
        if (this->mNPredeleteProcs == 0) {
          if (this->mPredeleteProcs != (Fl_Text_Predelete_Cb *)0x0) {
            operator_delete__(this->mPredeleteProcs);
          }
          this->mPredeleteProcs = (Fl_Text_Predelete_Cb *)0x0;
          if (this->mPredeleteCbArgs != (void **)0x0) {
            operator_delete__(this->mPredeleteCbArgs);
          }
          this->mPredeleteCbArgs = (void **)0x0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)this->mNPredeleteProcs;
          uVar3 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar3 = 0xffffffffffffffff;
          }
          pp_Var4 = (Fl_Text_Predelete_Cb *)operator_new__(uVar3);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)this->mNPredeleteProcs;
          uVar3 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar3 = 0xffffffffffffffff;
          }
          ppvVar5 = (void **)operator_new__(uVar3);
          for (newPreDeleteProcs._4_4_ = 0; newPreDeleteProcs._4_4_ < (int)newPreDeleteProcs;
              newPreDeleteProcs._4_4_ = newPreDeleteProcs._4_4_ + 1) {
            pp_Var4[newPreDeleteProcs._4_4_] = this->mPredeleteProcs[newPreDeleteProcs._4_4_];
            ppvVar5[newPreDeleteProcs._4_4_] = this->mPredeleteCbArgs[newPreDeleteProcs._4_4_];
          }
          for (; newPreDeleteProcs._4_4_ < this->mNPredeleteProcs;
              newPreDeleteProcs._4_4_ = newPreDeleteProcs._4_4_ + 1) {
            pp_Var4[newPreDeleteProcs._4_4_] = this->mPredeleteProcs[newPreDeleteProcs._4_4_ + 1];
            ppvVar5[newPreDeleteProcs._4_4_] = this->mPredeleteCbArgs[newPreDeleteProcs._4_4_ + 1];
          }
          if (this->mPredeleteProcs != (Fl_Text_Predelete_Cb *)0x0) {
            operator_delete__(this->mPredeleteProcs);
          }
          if (this->mPredeleteCbArgs != (void **)0x0) {
            operator_delete__(this->mPredeleteCbArgs);
          }
          this->mPredeleteProcs = pp_Var4;
          this->mPredeleteCbArgs = ppvVar5;
        }
      }
      return;
    }
    if ((this->mPredeleteProcs[newPreDeleteProcs._4_4_] == bufPreDeleteCB) &&
       (this->mPredeleteCbArgs[newPreDeleteProcs._4_4_] == cbArg)) {
      newPreDeleteProcs._0_4_ = newPreDeleteProcs._4_4_;
      goto LAB_0021ca77;
    }
    newPreDeleteProcs._4_4_ = newPreDeleteProcs._4_4_ + 1;
  } while( true );
}

Assistant:

void Fl_Text_Buffer::remove_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, void *cbArg)
{
  int i, toRemove = -1;
  /* find the matching callback to remove */
  for (i = 0; i < mNPredeleteProcs; i++) {
    if (mPredeleteProcs[i] == bufPreDeleteCB &&
	mPredeleteCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_predelete_callback(): Can't find pre-delete CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if any are left) */
  mNPredeleteProcs--;
  if (mNPredeleteProcs == 0) {
    delete[]mPredeleteProcs;
    mPredeleteProcs = NULL;
    delete[]mPredeleteCbArgs;
    mPredeleteCbArgs = NULL;
    return;
  }
  Fl_Text_Predelete_Cb *newPreDeleteProcs = new Fl_Text_Predelete_Cb[mNPredeleteProcs];
  void **newCBArgs = new void *[mNPredeleteProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i];
    newCBArgs[i] = mPredeleteCbArgs[i];
  }
  for (; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i + 1];
    newCBArgs[i] = mPredeleteCbArgs[i + 1];
  }
  delete[] mPredeleteProcs;
  delete[] mPredeleteCbArgs;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}